

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2Count.cpp
# Opt level: O0

void usage(void)

{
  ostream *this;
  
  this = std::operator<<((ostream *)&std::cout,
                         "\nUsage:\n    SAX2Count [options] <XML file | List file>\n\nThis program invokes the SAX2XMLReader, and then prints the\nnumber of elements, attributes, spaces and characters found\nin each XML file, using SAX2 API.\n\nOptions:\n    -l          Indicate the input file is a List File that has a list of xml files.\n                Default to off (Input file is an XML file).\n    -v=xxx      Validation scheme [always | never | auto*].\n    -f          Enable full schema constraint checking processing. Defaults to off.\n    -p          Enable namespace-prefixes feature. Defaults to off.\n    -n          Disable namespace processing. Defaults to on.\n                NOTE: THIS IS OPPOSITE FROM OTHER SAMPLES.\n    -s          Disable schema processing. Defaults to on.\n                NOTE: THIS IS OPPOSITE FROM OTHER SAMPLES.\n    -i          Disable identity constraint checking. Defaults to on.\n                NOTE: THIS IS OPPOSITE FROM OTHER SAMPLES.\n    -locale=ll_CC specify the locale, default: en_US.\n    -?          Show this help.\n\n  * = Default if not provided explicitly.\n"
                        );
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void usage()
{
    std::cout << "\nUsage:\n"
            "    SAX2Count [options] <XML file | List file>\n\n"
            "This program invokes the SAX2XMLReader, and then prints the\n"
            "number of elements, attributes, spaces and characters found\n"
            "in each XML file, using SAX2 API.\n\n"
            "Options:\n"
            "    -l          Indicate the input file is a List File that has a list of xml files.\n"
            "                Default to off (Input file is an XML file).\n"
            "    -v=xxx      Validation scheme [always | never | auto*].\n"
            "    -f          Enable full schema constraint checking processing. Defaults to off.\n"
            "    -p          Enable namespace-prefixes feature. Defaults to off.\n"
            "    -n          Disable namespace processing. Defaults to on.\n"
            "                NOTE: THIS IS OPPOSITE FROM OTHER SAMPLES.\n"
            "    -s          Disable schema processing. Defaults to on.\n"
            "                NOTE: THIS IS OPPOSITE FROM OTHER SAMPLES.\n"
            "    -i          Disable identity constraint checking. Defaults to on.\n"
            "                NOTE: THIS IS OPPOSITE FROM OTHER SAMPLES.\n"
            "    -locale=ll_CC specify the locale, default: en_US.\n"
            "    -?          Show this help.\n\n"
            "  * = Default if not provided explicitly.\n"
         << std::endl;
}